

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.hpp
# Opt level: O1

size_t __thiscall antlr::BaseAST::getNumberOfChildren(BaseAST *this)

{
  ASTRef *pAVar1;
  size_t sVar2;
  RefBaseAST t;
  ASTRefCount<antlr::BaseAST> local_18;
  
  local_18.ref = (this->down).ref;
  if (local_18.ref == (ASTRef *)0x0) {
    local_18.ref = (ASTRef *)0x0;
  }
  else {
    (local_18.ref)->count = (local_18.ref)->count + 1;
  }
  if ((local_18.ref == (ASTRef *)0x0) || ((local_18.ref)->ptr == (AST *)0x0)) {
    sVar2 = 0;
  }
  else {
    sVar2 = 1;
    pAVar1 = (local_18.ref)->ptr[1].ref;
    while ((pAVar1 != (ASTRef *)0x0 && (pAVar1->ptr != (AST *)0x0))) {
      ASTRefCount<antlr::BaseAST>::operator=
                (&local_18,(ASTRefCount<antlr::BaseAST> *)&(local_18.ref)->ptr[1].ref);
      sVar2 = sVar2 + 1;
      pAVar1 = (local_18.ref)->ptr[1].ref;
    }
  }
  ASTRefCount<antlr::BaseAST>::~ASTRefCount(&local_18);
  return sVar2;
}

Assistant:

ASTRefCount(const ASTRefCount<T>& other)
	: ref(other.ref ? other.ref->increment() : 0)
	{
	}